

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqbaselib.cpp
# Opt level: O2

SQInteger array_map(HSQUIRRELVM v)

{
  SQUnsignedInteger *pSVar1;
  SQObjectPtr *pSVar2;
  SQInteger SVar3;
  SQInteger SVar4;
  SQObjectPtr ret;
  
  SVar4 = 1;
  pSVar2 = stack_get(v,1);
  ret.super_SQObject._unVal.pArray =
       SQArray::Create(v->_sharedstate,((pSVar2->super_SQObject)._unVal.pOuter)->_idx);
  ret.super_SQObject._type = OT_ARRAY;
  pSVar1 = &((ret.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
            super_SQRefCounted._uiRef;
  *pSVar1 = *pSVar1 + 1;
  SVar3 = __map_array(ret.super_SQObject._unVal.pArray,(pSVar2->super_SQObject)._unVal.pArray,v);
  if (SVar3 < 0) {
    SVar4 = -1;
  }
  else {
    SQVM::Push(v,&ret);
  }
  SQObjectPtr::~SQObjectPtr(&ret);
  return SVar4;
}

Assistant:

static SQInteger array_map(HSQUIRRELVM v)
{
    SQObject &o = stack_get(v,1);
    SQInteger size = _array(o)->Size();
    SQObjectPtr ret = SQArray::Create(_ss(v),size);
    if(SQ_FAILED(__map_array(_array(ret),_array(o),v)))
        return SQ_ERROR;
    v->Push(ret);
    return 1;
}